

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVProcessChain.cxx
# Opt level: O1

void printResults(vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                  *actual,vector<ExpectedStatus,_std::allocator<ExpectedStatus>_> *expected)

{
  pointer pEVar1;
  pointer ppSVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ostream *this;
  long *plVar4;
  Status **a;
  pointer ppSVar5;
  pointer pEVar6;
  ulong local_78;
  int64_t iStack_70;
  code *local_68;
  code *pcStack_60;
  ulong local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
  *local_38;
  
  local_38 = actual;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Expected: ",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  pEVar6 = (expected->super__Vector_base<ExpectedStatus,_std::allocator<ExpectedStatus>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pEVar1 = (expected->super__Vector_base<ExpectedStatus,_std::allocator<ExpectedStatus>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar6 != pEVar1) {
    do {
      if (pEVar6->Finished == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  ExitStatus: ",0xe);
        iStack_70 = (pEVar6->Status).ExitStatus;
        local_78 = (ulong)pEVar6->MatchExitStatus;
        pcStack_60 = std::
                     _Function_handler<std::basic_ostream<char,_std::char_traits<char>_>_&(std::basic_ostream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testUVProcessChain.cxx:90:10)>
                     ::_M_invoke;
        local_68 = std::
                   _Function_handler<std::basic_ostream<char,_std::char_traits<char>_>_&(std::basic_ostream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testUVProcessChain.cxx:90:10)>
                   ::_M_manager;
        pbVar3 = std::
                 __invoke_impl<std::ostream&,printExpected<long>(bool,long_const&)::_lambda(std::ostream&)_1_&,std::ostream&>
                           (&local_78,&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(pbVar3,", TermSignal: ",0xe);
        uStack_50 = 0;
        local_58 = (ulong)(uint)(pEVar6->Status).TermSignal << 0x20 | (ulong)pEVar6->MatchTermSignal
        ;
        pcStack_40 = std::
                     _Function_handler<std::basic_ostream<char,_std::char_traits<char>_>_&(std::basic_ostream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testUVProcessChain.cxx:90:10)>
                     ::_M_invoke;
        local_48 = std::
                   _Function_handler<std::basic_ostream<char,_std::char_traits<char>_>_&(std::basic_ostream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testUVProcessChain.cxx:90:10)>
                   ::_M_manager;
        pbVar3 = std::
                 __invoke_impl<std::ostream&,printExpected<int>(bool,int_const&)::_lambda(std::ostream&)_1_&,std::ostream&>
                           (&local_58,pbVar3);
        std::ios::widen((char)pbVar3->_vptr_basic_ostream[-3] + (char)pbVar3);
        std::ostream::put((char)pbVar3);
        std::ostream::flush();
        if (local_48 != (code *)0x0) {
          (*local_48)(&local_58,&local_58,3);
        }
        if (local_68 != (code *)0x0) {
          (*local_68)(&local_78,&local_78,3);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  null",6);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
        std::ostream::put('8');
        std::ostream::flush();
      }
      pEVar6 = pEVar6 + 1;
    } while (pEVar6 != pEVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Actual:",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  ppSVar2 = (local_38->
            super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar5 = (local_38->
                 super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppSVar5 != ppSVar2;
      ppSVar5 = ppSVar5 + 1) {
    if (*ppSVar5 == (Status *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  null",6);
      plVar4 = &std::cout;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ExitStatus: ",0xe)
      ;
      this = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(this,", TermSignal: ",0xe);
      plVar4 = (long *)std::ostream::operator<<(this,(*ppSVar5)->TermSignal);
    }
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
  }
  return;
}

Assistant:

static void printResults(
  const std::vector<const cmUVProcessChain::Status*>& actual,
  const std::vector<ExpectedStatus>& expected)
{
  std::cout << "Expected: " << std::endl;
  for (auto const& e : expected) {
    if (e.Finished) {
      std::cout << "  ExitStatus: "
                << printExpected(e.MatchExitStatus, e.Status.ExitStatus)
                << ", TermSignal: "
                << printExpected(e.MatchTermSignal, e.Status.TermSignal)
                << std::endl;
    } else {
      std::cout << "  null" << std::endl;
    }
  }
  std::cout << "Actual:" << std::endl;
  for (auto const& a : actual) {
    if (a) {
      std::cout << "  ExitStatus: " << a->ExitStatus
                << ", TermSignal: " << a->TermSignal << std::endl;
    } else {
      std::cout << "  null" << std::endl;
    }
  }
}